

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O2

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this,cmLinkImplItem *r)

{
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem,&r->super_cmLinkItem);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,&r->Backtrace);
  this->FromGenex = r->FromGenex;
  return;
}

Assistant:

cmLinkImplItem(cmLinkImplItem const& r):
    cmLinkItem(r), Backtrace(r.Backtrace), FromGenex(r.FromGenex) {}